

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_APPLE_vertex_program_evaluators(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_APPLE_vertex_program_evaluators != 0) {
    glad_glEnableVertexAttribAPPLE =
         (PFNGLENABLEVERTEXATTRIBAPPLEPROC)(*load)("glEnableVertexAttribAPPLE");
    glad_glDisableVertexAttribAPPLE =
         (PFNGLDISABLEVERTEXATTRIBAPPLEPROC)(*load)("glDisableVertexAttribAPPLE");
    glad_glIsVertexAttribEnabledAPPLE =
         (PFNGLISVERTEXATTRIBENABLEDAPPLEPROC)(*load)("glIsVertexAttribEnabledAPPLE");
    glad_glMapVertexAttrib1dAPPLE =
         (PFNGLMAPVERTEXATTRIB1DAPPLEPROC)(*load)("glMapVertexAttrib1dAPPLE");
    glad_glMapVertexAttrib1fAPPLE =
         (PFNGLMAPVERTEXATTRIB1FAPPLEPROC)(*load)("glMapVertexAttrib1fAPPLE");
    glad_glMapVertexAttrib2dAPPLE =
         (PFNGLMAPVERTEXATTRIB2DAPPLEPROC)(*load)("glMapVertexAttrib2dAPPLE");
    glad_glMapVertexAttrib2fAPPLE =
         (PFNGLMAPVERTEXATTRIB2FAPPLEPROC)(*load)("glMapVertexAttrib2fAPPLE");
  }
  return;
}

Assistant:

static void load_GL_APPLE_vertex_program_evaluators(GLADloadproc load) {
	if(!GLAD_GL_APPLE_vertex_program_evaluators) return;
	glad_glEnableVertexAttribAPPLE = (PFNGLENABLEVERTEXATTRIBAPPLEPROC)load("glEnableVertexAttribAPPLE");
	glad_glDisableVertexAttribAPPLE = (PFNGLDISABLEVERTEXATTRIBAPPLEPROC)load("glDisableVertexAttribAPPLE");
	glad_glIsVertexAttribEnabledAPPLE = (PFNGLISVERTEXATTRIBENABLEDAPPLEPROC)load("glIsVertexAttribEnabledAPPLE");
	glad_glMapVertexAttrib1dAPPLE = (PFNGLMAPVERTEXATTRIB1DAPPLEPROC)load("glMapVertexAttrib1dAPPLE");
	glad_glMapVertexAttrib1fAPPLE = (PFNGLMAPVERTEXATTRIB1FAPPLEPROC)load("glMapVertexAttrib1fAPPLE");
	glad_glMapVertexAttrib2dAPPLE = (PFNGLMAPVERTEXATTRIB2DAPPLEPROC)load("glMapVertexAttrib2dAPPLE");
	glad_glMapVertexAttrib2fAPPLE = (PFNGLMAPVERTEXATTRIB2FAPPLEPROC)load("glMapVertexAttrib2fAPPLE");
}